

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestDeprecatedFields::_InternalSerialize
          (TestDeprecatedFields *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypes_NestedMessage *value;
  size_t __n;
  TestDeprecatedFields *value_00;
  ulong uVar1;
  anon_union_64_1_493b367e_for_TestDeprecatedFields_3 aVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  uint8_t *puVar4;
  int iVar5;
  int index;
  char *in_R9;
  string_view s;
  string_view field_name;
  
  aVar2 = this->field_0;
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.deprecated_int32_,target);
  }
  if ((this->field_0)._impl_._oneof_case_[0] == 2) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.oneof_fields_.deprecated_int32_in_oneof_,
                        target);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
    value = (this->field_0)._impl_.deprecated_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x10);
  index = 0;
  if (iVar5 < 1) {
    iVar5 = index;
  }
  for (; iVar5 != index; index = index + 1) {
    pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.deprecated_repeated_string_.
                         super_RepeatedPtrFieldBase,index);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestDeprecatedFields.deprecated_repeated_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar3->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar3->_M_string_length,1,0x40,field_name);
    __n = pVVar3->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\"';
      target[1] = (uint8_t)__n;
      memcpy(target + 2,(pVVar3->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      s._M_str = (pVVar3->_M_dataplus)._M_p;
      s._M_len = __n;
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,4,s,target);
    }
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
    value_00 = (this->field_0)._impl_.nested_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDeprecatedFields::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDeprecatedFields& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestDeprecatedFields)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 deprecated_int32 = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_deprecated_int32(), target);
  }

  // int32 deprecated_int32_in_oneof = 2 [deprecated = true];
  if (this_.oneof_fields_case() == kDeprecatedInt32InOneof) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_deprecated_int32_in_oneof(), target);
  }

  // .edition_unittest.TestAllTypes.NestedMessage deprecated_message = 3 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.deprecated_message_, this_._impl_.deprecated_message_->GetCachedSize(), target,
        stream);
  }

  // repeated string deprecated_repeated_string = 4 [deprecated = true];
  for (int i = 0, n = this_._internal_deprecated_repeated_string_size(); i < n; ++i) {
    const auto& s = this_._internal_deprecated_repeated_string().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestDeprecatedFields.deprecated_repeated_string");
    target = stream->WriteString(4, s, target);
  }

  // .edition_unittest.TestDeprecatedFields nested = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.nested_, this_._impl_.nested_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestDeprecatedFields)
  return target;
}